

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u64 fts3ChecksumEntry(char *zTerm,int nTerm,int iLangid,int iIndex,i64 iDocid,int iCol,int iPos)

{
  u64 uVar1;
  ulong uVar2;
  ulong uVar3;
  u64 ret;
  
  uVar1 = (long)iPos + ((long)iCol + ((long)iIndex + ((long)iLangid + iDocid * 9) * 9) * 9) * 9;
  uVar2 = 0;
  uVar3 = (ulong)(uint)nTerm;
  if (nTerm < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = uVar1 * 9 + (long)zTerm[uVar2];
  }
  return uVar1;
}

Assistant:

static u64 fts3ChecksumEntry(
  const char *zTerm,              /* Pointer to buffer containing term */
  int nTerm,                      /* Size of zTerm in bytes */
  int iLangid,                    /* Language id for current row */
  int iIndex,                     /* Index (0..Fts3Table.nIndex-1) */
  i64 iDocid,                     /* Docid for current row. */
  int iCol,                       /* Column number */
  int iPos                        /* Position */
){
  int i;
  u64 ret = (u64)iDocid;

  ret += (ret<<3) + iLangid;
  ret += (ret<<3) + iIndex;
  ret += (ret<<3) + iCol;
  ret += (ret<<3) + iPos;
  for(i=0; i<nTerm; i++) ret += (ret<<3) + zTerm[i];

  return ret;
}